

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

double hcephes_log1p(double x)

{
  double dVar1;
  double dVar2;
  double z;
  double x_local;
  
  dVar1 = x + 1.0;
  if ((dVar1 < 0.7071067811865476) || (1.4142135623730951 < dVar1)) {
    x_local = log(dVar1);
  }
  else {
    dVar1 = hcephes_polevl(x,LP,6);
    dVar2 = hcephes_p1evl(x,LQ,6);
    x_local = x + x * x * -0.5 + x * ((x * x * dVar1) / dVar2);
  }
  return x_local;
}

Assistant:

HCEPHES_API double hcephes_log1p(double x) {
    double z;

    z = 1.0 + x;
    if ((z < SQRTH) || (z > SQRT2))
        return (log(z));
    z = x * x;
    z = -0.5 * z + x * (z * hcephes_polevl(x, LP, 6) / hcephes_p1evl(x, LQ, 6));
    return (x + z);
}